

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  Geometry *pGVar3;
  RTCIntersectArguments *pRVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  bool bVar55;
  ulong uVar56;
  long lVar57;
  int iVar58;
  long lVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  Scene *pSVar63;
  ulong uVar64;
  undefined4 uVar65;
  ulong unaff_R13;
  size_t mask;
  ulong uVar66;
  ulong uVar67;
  bool bVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  float fVar80;
  float fVar81;
  undefined1 auVar75 [32];
  float fVar82;
  float fVar88;
  float fVar89;
  undefined1 auVar83 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar84 [32];
  float fVar90;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar94;
  float fVar97;
  float fVar98;
  undefined1 auVar95 [16];
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar96 [32];
  float fVar103;
  float fVar104;
  float fVar111;
  float fVar113;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  float fVar112;
  float fVar114;
  undefined1 auVar109 [32];
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar110 [64];
  float fVar118;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar121 [64];
  undefined1 auVar128 [64];
  float fVar129;
  float fVar130;
  undefined1 auVar131 [32];
  float fVar141;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar134 [64];
  float fVar142;
  float fVar143;
  undefined1 auVar144 [32];
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar145 [64];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  float fVar161;
  undefined1 auVar162 [32];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar163 [64];
  float fVar170;
  float fVar171;
  undefined1 auVar172 [32];
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar173 [64];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  float fVar190;
  float fVar191;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar192 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong *local_17f0;
  int local_17dc;
  ulong local_17d8;
  ulong local_17d0;
  ulong local_17c8;
  ulong local_17c0;
  ulong local_17b8;
  ulong local_17b0;
  ulong local_17a8;
  undefined8 local_17a0;
  float fStack_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  undefined4 local_1780;
  float local_177c;
  float local_1778;
  undefined4 local_1774;
  undefined4 local_1770;
  undefined4 local_176c;
  uint local_1768;
  uint local_1764;
  uint local_1760;
  RTCFilterFunctionNArguments local_1750;
  float local_1720;
  float fStack_171c;
  float fStack_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  undefined8 local_1700;
  float fStack_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float fStack_16e8;
  float fStack_16e4;
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  ulong local_1200;
  ulong local_11f8 [569];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      local_17f0 = local_11f8;
      local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar2 = (ray->dir).field_0;
      auVar13 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar69._8_4_ = 0x7fffffff;
      auVar69._0_8_ = 0x7fffffff7fffffff;
      auVar69._12_4_ = 0x7fffffff;
      auVar69 = vandps_avx((undefined1  [16])aVar2,auVar69);
      auVar105._8_4_ = 0x219392ef;
      auVar105._0_8_ = 0x219392ef219392ef;
      auVar105._12_4_ = 0x219392ef;
      auVar69 = vcmpps_avx(auVar69,auVar105,1);
      auVar106._8_4_ = 0x3f800000;
      auVar106._0_8_ = &DAT_3f8000003f800000;
      auVar106._12_4_ = 0x3f800000;
      auVar105 = vdivps_avx(auVar106,(undefined1  [16])aVar2);
      auVar107._8_4_ = 0x5d5e0b6b;
      auVar107._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar107._12_4_ = 0x5d5e0b6b;
      auVar69 = vblendvps_avx(auVar105,auVar107,auVar69);
      auVar95._0_4_ = auVar69._0_4_ * 0.99999964;
      auVar95._4_4_ = auVar69._4_4_ * 0.99999964;
      auVar95._8_4_ = auVar69._8_4_ * 0.99999964;
      auVar95._12_4_ = auVar69._12_4_ * 0.99999964;
      uVar65 = *(undefined4 *)&(ray->org).field_0;
      local_15a0._4_4_ = uVar65;
      local_15a0._0_4_ = uVar65;
      local_15a0._8_4_ = uVar65;
      local_15a0._12_4_ = uVar65;
      local_15a0._16_4_ = uVar65;
      local_15a0._20_4_ = uVar65;
      local_15a0._24_4_ = uVar65;
      local_15a0._28_4_ = uVar65;
      auVar128 = ZEXT3264(local_15a0);
      uVar65 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_15c0._4_4_ = uVar65;
      local_15c0._0_4_ = uVar65;
      local_15c0._8_4_ = uVar65;
      local_15c0._12_4_ = uVar65;
      local_15c0._16_4_ = uVar65;
      local_15c0._20_4_ = uVar65;
      local_15c0._24_4_ = uVar65;
      local_15c0._28_4_ = uVar65;
      auVar134 = ZEXT3264(local_15c0);
      uVar65 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_15e0._4_4_ = uVar65;
      local_15e0._0_4_ = uVar65;
      local_15e0._8_4_ = uVar65;
      local_15e0._12_4_ = uVar65;
      local_15e0._16_4_ = uVar65;
      local_15e0._20_4_ = uVar65;
      local_15e0._24_4_ = uVar65;
      local_15e0._28_4_ = uVar65;
      auVar145 = ZEXT3264(local_15e0);
      auVar83._0_4_ = auVar69._0_4_ * 1.0000004;
      auVar83._4_4_ = auVar69._4_4_ * 1.0000004;
      auVar83._8_4_ = auVar69._8_4_ * 1.0000004;
      auVar83._12_4_ = auVar69._12_4_ * 1.0000004;
      auVar69 = vshufps_avx(auVar95,auVar95,0);
      local_1600._16_16_ = auVar69;
      local_1600._0_16_ = auVar69;
      auVar160 = ZEXT3264(local_1600);
      auVar69 = vmovshdup_avx(auVar95);
      auVar105 = vshufps_avx(auVar95,auVar95,0x55);
      local_1620._16_16_ = auVar105;
      local_1620._0_16_ = auVar105;
      auVar163 = ZEXT3264(local_1620);
      auVar105 = vshufpd_avx(auVar95,auVar95,1);
      auVar106 = vshufps_avx(auVar95,auVar95,0xaa);
      local_1640._16_16_ = auVar106;
      local_1640._0_16_ = auVar106;
      auVar173 = ZEXT3264(local_1640);
      auVar106 = vshufps_avx(auVar83,auVar83,0);
      local_1660._16_16_ = auVar106;
      local_1660._0_16_ = auVar106;
      auVar187 = ZEXT3264(local_1660);
      auVar106 = vshufps_avx(auVar83,auVar83,0x55);
      local_1680._16_16_ = auVar106;
      local_1680._0_16_ = auVar106;
      auVar189 = ZEXT3264(local_1680);
      auVar106 = vshufps_avx(auVar83,auVar83,0xaa);
      local_17c8 = (ulong)(auVar95._0_4_ < 0.0) << 5;
      local_17d0 = (ulong)(auVar69._0_4_ < 0.0) << 5 | 0x40;
      local_16a0._16_16_ = auVar106;
      local_16a0._0_16_ = auVar106;
      auVar110 = ZEXT3264(local_16a0);
      local_17d8 = (ulong)(auVar105._0_4_ < 0.0) << 5 | 0x80;
      uVar66 = local_17c8 ^ 0x20;
      uVar67 = local_17d0 ^ 0x20;
      uVar64 = local_17d8 ^ 0x20;
      auVar69 = vshufps_avx(auVar13,auVar13,0);
      local_16c0._16_16_ = auVar69;
      local_16c0._0_16_ = auVar69;
      auVar121 = ZEXT3264(local_16c0);
      auVar69 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
      local_16e0._16_16_ = auVar69;
      local_16e0._0_16_ = auVar69;
      auVar192 = ZEXT3264(local_16e0);
      local_1520._16_16_ = mm_lookupmask_ps._240_16_;
      local_1520._0_16_ = mm_lookupmask_ps._0_16_;
      auVar73._8_4_ = 0x3f800000;
      auVar73._0_8_ = &DAT_3f8000003f800000;
      auVar73._12_4_ = 0x3f800000;
      auVar73._16_4_ = 0x3f800000;
      auVar73._20_4_ = 0x3f800000;
      auVar73._24_4_ = 0x3f800000;
      auVar73._28_4_ = 0x3f800000;
      auVar70._8_4_ = 0xbf800000;
      auVar70._0_8_ = 0xbf800000bf800000;
      auVar70._12_4_ = 0xbf800000;
      auVar70._16_4_ = 0xbf800000;
      auVar70._20_4_ = 0xbf800000;
      auVar70._24_4_ = 0xbf800000;
      auVar70._28_4_ = 0xbf800000;
      local_1540 = vblendvps_avx(auVar73,auVar70,local_1520);
      local_17b0 = uVar66;
      local_17b8 = uVar67;
      local_17c0 = uVar64;
      do {
        if (local_17f0 == &local_1200) {
          return;
        }
        uVar61 = local_17f0[-1];
        local_17f0 = local_17f0 + -1;
        do {
          if ((uVar61 & 8) == 0) {
            auVar70 = vsubps_avx(*(undefined1 (*) [32])(uVar61 + 0x40 + local_17c8),auVar128._0_32_)
            ;
            auVar14._4_4_ = auVar160._4_4_ * auVar70._4_4_;
            auVar14._0_4_ = auVar160._0_4_ * auVar70._0_4_;
            auVar14._8_4_ = auVar160._8_4_ * auVar70._8_4_;
            auVar14._12_4_ = auVar160._12_4_ * auVar70._12_4_;
            auVar14._16_4_ = auVar160._16_4_ * auVar70._16_4_;
            auVar14._20_4_ = auVar160._20_4_ * auVar70._20_4_;
            auVar14._24_4_ = auVar160._24_4_ * auVar70._24_4_;
            auVar14._28_4_ = auVar70._28_4_;
            auVar70 = vsubps_avx(*(undefined1 (*) [32])(uVar61 + 0x40 + local_17d0),auVar134._0_32_)
            ;
            auVar15._4_4_ = auVar163._4_4_ * auVar70._4_4_;
            auVar15._0_4_ = auVar163._0_4_ * auVar70._0_4_;
            auVar15._8_4_ = auVar163._8_4_ * auVar70._8_4_;
            auVar15._12_4_ = auVar163._12_4_ * auVar70._12_4_;
            auVar15._16_4_ = auVar163._16_4_ * auVar70._16_4_;
            auVar15._20_4_ = auVar163._20_4_ * auVar70._20_4_;
            auVar15._24_4_ = auVar163._24_4_ * auVar70._24_4_;
            auVar15._28_4_ = auVar70._28_4_;
            auVar70 = vmaxps_avx(auVar14,auVar15);
            auVar73 = vsubps_avx(*(undefined1 (*) [32])(uVar61 + 0x40 + local_17d8),auVar145._0_32_)
            ;
            auVar16._4_4_ = auVar173._4_4_ * auVar73._4_4_;
            auVar16._0_4_ = auVar173._0_4_ * auVar73._0_4_;
            auVar16._8_4_ = auVar173._8_4_ * auVar73._8_4_;
            auVar16._12_4_ = auVar173._12_4_ * auVar73._12_4_;
            auVar16._16_4_ = auVar173._16_4_ * auVar73._16_4_;
            auVar16._20_4_ = auVar173._20_4_ * auVar73._20_4_;
            auVar16._24_4_ = auVar173._24_4_ * auVar73._24_4_;
            auVar16._28_4_ = auVar73._28_4_;
            auVar73 = vmaxps_avx(auVar16,auVar121._0_32_);
            auVar70 = vmaxps_avx(auVar70,auVar73);
            auVar73 = vsubps_avx(*(undefined1 (*) [32])(uVar61 + 0x40 + uVar66),auVar128._0_32_);
            auVar17._4_4_ = auVar187._4_4_ * auVar73._4_4_;
            auVar17._0_4_ = auVar187._0_4_ * auVar73._0_4_;
            auVar17._8_4_ = auVar187._8_4_ * auVar73._8_4_;
            auVar17._12_4_ = auVar187._12_4_ * auVar73._12_4_;
            auVar17._16_4_ = auVar187._16_4_ * auVar73._16_4_;
            auVar17._20_4_ = auVar187._20_4_ * auVar73._20_4_;
            auVar17._24_4_ = auVar187._24_4_ * auVar73._24_4_;
            auVar17._28_4_ = auVar73._28_4_;
            auVar73 = vsubps_avx(*(undefined1 (*) [32])(uVar61 + 0x40 + uVar67),auVar134._0_32_);
            auVar18._4_4_ = auVar189._4_4_ * auVar73._4_4_;
            auVar18._0_4_ = auVar189._0_4_ * auVar73._0_4_;
            auVar18._8_4_ = auVar189._8_4_ * auVar73._8_4_;
            auVar18._12_4_ = auVar189._12_4_ * auVar73._12_4_;
            auVar18._16_4_ = auVar189._16_4_ * auVar73._16_4_;
            auVar18._20_4_ = auVar189._20_4_ * auVar73._20_4_;
            auVar18._24_4_ = auVar189._24_4_ * auVar73._24_4_;
            auVar18._28_4_ = auVar73._28_4_;
            auVar73 = vminps_avx(auVar17,auVar18);
            auVar14 = vsubps_avx(*(undefined1 (*) [32])(uVar61 + 0x40 + uVar64),auVar145._0_32_);
            auVar19._4_4_ = auVar110._4_4_ * auVar14._4_4_;
            auVar19._0_4_ = auVar110._0_4_ * auVar14._0_4_;
            auVar19._8_4_ = auVar110._8_4_ * auVar14._8_4_;
            auVar19._12_4_ = auVar110._12_4_ * auVar14._12_4_;
            auVar19._16_4_ = auVar110._16_4_ * auVar14._16_4_;
            auVar19._20_4_ = auVar110._20_4_ * auVar14._20_4_;
            auVar19._24_4_ = auVar110._24_4_ * auVar14._24_4_;
            auVar19._28_4_ = auVar14._28_4_;
            auVar14 = vminps_avx(auVar19,auVar192._0_32_);
            auVar73 = vminps_avx(auVar73,auVar14);
            auVar70 = vcmpps_avx(auVar70,auVar73,2);
            uVar65 = vmovmskps_avx(auVar70);
            unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),uVar65);
          }
          if ((uVar61 & 8) == 0) {
            if (unaff_R13 == 0) {
              iVar58 = 4;
            }
            else {
              uVar60 = uVar61 & 0xfffffffffffffff0;
              lVar59 = 0;
              if (unaff_R13 != 0) {
                for (; (unaff_R13 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                }
              }
              iVar58 = 0;
              uVar61 = *(ulong *)(uVar60 + lVar59 * 8);
              uVar62 = unaff_R13 - 1 & unaff_R13;
              if (uVar62 != 0) {
                *local_17f0 = uVar61;
                lVar59 = 0;
                if (uVar62 != 0) {
                  for (; (uVar62 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                  }
                }
                uVar56 = uVar62 - 1;
                while( true ) {
                  local_17f0 = local_17f0 + 1;
                  uVar61 = *(ulong *)(uVar60 + lVar59 * 8);
                  uVar56 = uVar56 & uVar62;
                  if (uVar56 == 0) break;
                  *local_17f0 = uVar61;
                  lVar59 = 0;
                  if (uVar56 != 0) {
                    for (; (uVar56 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                    }
                  }
                  uVar62 = uVar56 - 1;
                }
                iVar58 = 0;
              }
            }
          }
          else {
            iVar58 = 6;
          }
        } while (iVar58 == 0);
        if (iVar58 == 6) {
          iVar58 = 0;
          uVar60 = (ulong)((uint)uVar61 & 0xf) - 8;
          bVar68 = uVar60 != 0;
          if (bVar68) {
            uVar61 = uVar61 & 0xfffffffffffffff0;
            local_17a8 = 0;
            do {
              lVar57 = local_17a8 * 0xe0;
              lVar59 = uVar61 + 0xd0 + lVar57;
              local_1400 = *(undefined8 *)(lVar59 + 0x10);
              uStack_13f8 = *(undefined8 *)(lVar59 + 0x18);
              lVar59 = uVar61 + 0xc0 + lVar57;
              local_13e0 = *(undefined8 *)(lVar59 + 0x10);
              uStack_13d8 = *(undefined8 *)(lVar59 + 0x18);
              uStack_13d0 = local_13e0;
              uStack_13c8 = uStack_13d8;
              uStack_13f0 = local_1400;
              uStack_13e8 = uStack_13f8;
              auVar71._16_16_ = *(undefined1 (*) [16])(uVar61 + 0x60 + lVar57);
              auVar71._0_16_ = *(undefined1 (*) [16])(uVar61 + lVar57);
              auVar84._16_16_ = *(undefined1 (*) [16])(uVar61 + 0x70 + lVar57);
              auVar84._0_16_ = *(undefined1 (*) [16])(uVar61 + 0x10 + lVar57);
              auVar74._16_16_ = *(undefined1 (*) [16])(uVar61 + 0x80 + lVar57);
              auVar74._0_16_ = *(undefined1 (*) [16])(uVar61 + 0x20 + lVar57);
              auVar69 = *(undefined1 (*) [16])(uVar61 + 0x30 + lVar57);
              auVar96._16_16_ = auVar69;
              auVar96._0_16_ = auVar69;
              auVar69 = *(undefined1 (*) [16])(uVar61 + 0x40 + lVar57);
              auVar108._16_16_ = auVar69;
              auVar108._0_16_ = auVar69;
              auVar69 = *(undefined1 (*) [16])(uVar61 + 0x50 + lVar57);
              auVar188._16_16_ = auVar69;
              auVar188._0_16_ = auVar69;
              auVar69 = *(undefined1 (*) [16])(uVar61 + 0x90 + lVar57);
              auVar131._16_16_ = auVar69;
              auVar131._0_16_ = auVar69;
              auVar105 = *(undefined1 (*) [16])(uVar61 + 0xa0 + lVar57);
              auVar144._16_16_ = auVar105;
              auVar144._0_16_ = auVar105;
              auVar13 = *(undefined1 (*) [16])(uVar61 + 0xb0 + lVar57);
              auVar158._16_16_ = auVar13;
              auVar158._0_16_ = auVar13;
              uVar65 = *(undefined4 *)&(ray->org).field_0;
              auVar162._4_4_ = uVar65;
              auVar162._0_4_ = uVar65;
              auVar162._8_4_ = uVar65;
              auVar162._12_4_ = uVar65;
              auVar162._16_4_ = uVar65;
              auVar162._20_4_ = uVar65;
              auVar162._24_4_ = uVar65;
              auVar162._28_4_ = uVar65;
              uVar65 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar172._4_4_ = uVar65;
              auVar172._0_4_ = uVar65;
              auVar172._8_4_ = uVar65;
              auVar172._12_4_ = uVar65;
              auVar172._16_4_ = uVar65;
              auVar172._20_4_ = uVar65;
              auVar172._24_4_ = uVar65;
              auVar172._28_4_ = uVar65;
              uVar65 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar186._4_4_ = uVar65;
              auVar186._0_4_ = uVar65;
              auVar186._8_4_ = uVar65;
              auVar186._12_4_ = uVar65;
              auVar186._16_4_ = uVar65;
              auVar186._20_4_ = uVar65;
              auVar186._24_4_ = uVar65;
              auVar186._28_4_ = uVar65;
              local_1560 = vsubps_avx(auVar71,auVar162);
              local_1580 = vsubps_avx(auVar84,auVar172);
              local_1420 = vsubps_avx(auVar74,auVar186);
              auVar70 = vsubps_avx(auVar96,auVar162);
              auVar73 = vsubps_avx(auVar108,auVar172);
              auVar14 = vsubps_avx(auVar188,auVar186);
              auVar15 = vsubps_avx(auVar131,auVar162);
              auVar16 = vsubps_avx(auVar144,auVar172);
              auVar17 = vsubps_avx(auVar158,auVar186);
              local_1440 = vsubps_avx(auVar15,local_1560);
              local_1460 = vsubps_avx(auVar16,local_1580);
              local_1480 = vsubps_avx(auVar17,local_1420);
              fVar190 = local_1580._0_4_;
              fVar94 = fVar190 + auVar16._0_4_;
              fVar193 = local_1580._4_4_;
              fVar97 = fVar193 + auVar16._4_4_;
              fVar195 = local_1580._8_4_;
              fVar98 = fVar195 + auVar16._8_4_;
              fVar197 = local_1580._12_4_;
              fVar99 = fVar197 + auVar16._12_4_;
              fVar199 = local_1580._16_4_;
              fVar100 = fVar199 + auVar16._16_4_;
              fVar201 = local_1580._20_4_;
              fVar101 = fVar201 + auVar16._20_4_;
              fVar203 = local_1580._24_4_;
              fVar102 = fVar203 + auVar16._24_4_;
              fVar80 = local_1580._28_4_;
              fVar1 = local_1420._0_4_;
              fVar103 = auVar17._0_4_ + fVar1;
              fVar6 = local_1420._4_4_;
              fVar111 = auVar17._4_4_ + fVar6;
              fVar8 = local_1420._8_4_;
              fVar113 = auVar17._8_4_ + fVar8;
              fVar10 = local_1420._12_4_;
              fVar114 = auVar17._12_4_ + fVar10;
              fVar77 = local_1420._16_4_;
              fVar115 = auVar17._16_4_ + fVar77;
              fVar79 = local_1420._20_4_;
              fVar116 = auVar17._20_4_ + fVar79;
              fVar11 = local_1420._24_4_;
              fVar117 = auVar17._24_4_ + fVar11;
              fVar130 = local_1420._28_4_;
              fVar118 = local_1480._0_4_;
              fVar122 = local_1480._4_4_;
              auVar20._4_4_ = fVar122 * fVar97;
              auVar20._0_4_ = fVar118 * fVar94;
              fVar123 = local_1480._8_4_;
              auVar20._8_4_ = fVar123 * fVar98;
              fVar124 = local_1480._12_4_;
              auVar20._12_4_ = fVar124 * fVar99;
              fVar125 = local_1480._16_4_;
              auVar20._16_4_ = fVar125 * fVar100;
              fVar126 = local_1480._20_4_;
              auVar20._20_4_ = fVar126 * fVar101;
              fVar127 = local_1480._24_4_;
              auVar20._24_4_ = fVar127 * fVar102;
              auVar20._28_4_ = auVar69._12_4_;
              fVar170 = local_1460._0_4_;
              fVar174 = local_1460._4_4_;
              auVar21._4_4_ = fVar174 * fVar111;
              auVar21._0_4_ = fVar170 * fVar103;
              fVar176 = local_1460._8_4_;
              auVar21._8_4_ = fVar176 * fVar113;
              fVar178 = local_1460._12_4_;
              auVar21._12_4_ = fVar178 * fVar114;
              fVar180 = local_1460._16_4_;
              auVar21._16_4_ = fVar180 * fVar115;
              fVar182 = local_1460._20_4_;
              auVar21._20_4_ = fVar182 * fVar116;
              fVar184 = local_1460._24_4_;
              auVar21._24_4_ = fVar184 * fVar117;
              auVar21._28_4_ = auVar105._12_4_;
              auVar18 = vsubps_avx(auVar21,auVar20);
              fVar5 = local_1560._0_4_;
              fVar129 = auVar15._0_4_ + fVar5;
              fVar7 = local_1560._4_4_;
              fVar135 = auVar15._4_4_ + fVar7;
              fVar9 = local_1560._8_4_;
              fVar136 = auVar15._8_4_ + fVar9;
              fVar76 = local_1560._12_4_;
              fVar137 = auVar15._12_4_ + fVar76;
              fVar78 = local_1560._16_4_;
              fVar138 = auVar15._16_4_ + fVar78;
              fVar81 = local_1560._20_4_;
              fVar139 = auVar15._20_4_ + fVar81;
              fVar12 = local_1560._24_4_;
              fVar140 = auVar15._24_4_ + fVar12;
              fVar161 = local_1440._0_4_;
              fVar164 = local_1440._4_4_;
              auVar22._4_4_ = fVar164 * fVar111;
              auVar22._0_4_ = fVar161 * fVar103;
              fVar165 = local_1440._8_4_;
              auVar22._8_4_ = fVar165 * fVar113;
              fVar166 = local_1440._12_4_;
              auVar22._12_4_ = fVar166 * fVar114;
              fVar167 = local_1440._16_4_;
              auVar22._16_4_ = fVar167 * fVar115;
              fVar168 = local_1440._20_4_;
              auVar22._20_4_ = fVar168 * fVar116;
              fVar169 = local_1440._24_4_;
              auVar22._24_4_ = fVar169 * fVar117;
              auVar22._28_4_ = auVar17._28_4_ + fVar130;
              auVar71 = local_1480;
              auVar23._4_4_ = fVar135 * fVar122;
              auVar23._0_4_ = fVar129 * fVar118;
              auVar23._8_4_ = fVar136 * fVar123;
              auVar23._12_4_ = fVar137 * fVar124;
              auVar23._16_4_ = fVar138 * fVar125;
              auVar23._20_4_ = fVar139 * fVar126;
              auVar23._24_4_ = fVar140 * fVar127;
              auVar23._28_4_ = auVar13._12_4_;
              auVar19 = vsubps_avx(auVar23,auVar22);
              auVar24._4_4_ = fVar174 * fVar135;
              auVar24._0_4_ = fVar170 * fVar129;
              auVar24._8_4_ = fVar176 * fVar136;
              auVar24._12_4_ = fVar178 * fVar137;
              auVar24._16_4_ = fVar180 * fVar138;
              auVar24._20_4_ = fVar182 * fVar139;
              auVar24._24_4_ = fVar184 * fVar140;
              auVar24._28_4_ = auVar15._28_4_ + local_1560._28_4_;
              auVar25._4_4_ = fVar164 * fVar97;
              auVar25._0_4_ = fVar161 * fVar94;
              auVar25._8_4_ = fVar165 * fVar98;
              auVar25._12_4_ = fVar166 * fVar99;
              auVar25._16_4_ = fVar167 * fVar100;
              auVar25._20_4_ = fVar168 * fVar101;
              auVar25._24_4_ = fVar169 * fVar102;
              auVar25._28_4_ = fVar80 + auVar16._28_4_;
              auVar20 = vsubps_avx(auVar25,auVar24);
              local_1700._4_4_ = (ray->dir).field_0.m128[1];
              fStack_171c = (ray->dir).field_0.m128[2];
              local_17a0._4_4_ = (ray->dir).field_0.m128[0];
              local_14c0._0_4_ =
                   local_17a0._4_4_ * auVar18._0_4_ +
                   local_1700._4_4_ * auVar19._0_4_ + fStack_171c * auVar20._0_4_;
              local_14c0._4_4_ =
                   local_17a0._4_4_ * auVar18._4_4_ +
                   local_1700._4_4_ * auVar19._4_4_ + fStack_171c * auVar20._4_4_;
              local_14c0._8_4_ =
                   local_17a0._4_4_ * auVar18._8_4_ +
                   local_1700._4_4_ * auVar19._8_4_ + fStack_171c * auVar20._8_4_;
              local_14c0._12_4_ =
                   local_17a0._4_4_ * auVar18._12_4_ +
                   local_1700._4_4_ * auVar19._12_4_ + fStack_171c * auVar20._12_4_;
              local_14c0._16_4_ =
                   local_17a0._4_4_ * auVar18._16_4_ +
                   local_1700._4_4_ * auVar19._16_4_ + fStack_171c * auVar20._16_4_;
              local_14c0._20_4_ =
                   local_17a0._4_4_ * auVar18._20_4_ +
                   local_1700._4_4_ * auVar19._20_4_ + fStack_171c * auVar20._20_4_;
              local_14c0._24_4_ =
                   local_17a0._4_4_ * auVar18._24_4_ +
                   local_1700._4_4_ * auVar19._24_4_ + fStack_171c * auVar20._24_4_;
              local_14c0._28_4_ = auVar19._28_4_ + auVar19._28_4_ + auVar20._28_4_;
              auVar18 = vsubps_avx(local_1580,auVar73);
              local_14a0 = vsubps_avx(local_1420,auVar14);
              fVar97 = fVar190 + auVar73._0_4_;
              fVar98 = fVar193 + auVar73._4_4_;
              fVar99 = fVar195 + auVar73._8_4_;
              fVar100 = fVar197 + auVar73._12_4_;
              fVar101 = fVar199 + auVar73._16_4_;
              fVar102 = fVar201 + auVar73._20_4_;
              fVar103 = fVar203 + auVar73._24_4_;
              fVar94 = auVar73._28_4_;
              fVar111 = auVar14._0_4_ + fVar1;
              fVar113 = auVar14._4_4_ + fVar6;
              fVar114 = auVar14._8_4_ + fVar8;
              fVar115 = auVar14._12_4_ + fVar10;
              fVar116 = auVar14._16_4_ + fVar77;
              fVar117 = auVar14._20_4_ + fVar79;
              fVar129 = auVar14._24_4_ + fVar11;
              fVar171 = local_14a0._0_4_;
              fVar175 = local_14a0._4_4_;
              auVar26._4_4_ = fVar175 * fVar98;
              auVar26._0_4_ = fVar171 * fVar97;
              fVar177 = local_14a0._8_4_;
              auVar26._8_4_ = fVar177 * fVar99;
              fVar179 = local_14a0._12_4_;
              auVar26._12_4_ = fVar179 * fVar100;
              fVar181 = local_14a0._16_4_;
              auVar26._16_4_ = fVar181 * fVar101;
              fVar183 = local_14a0._20_4_;
              auVar26._20_4_ = fVar183 * fVar102;
              fVar185 = local_14a0._24_4_;
              auVar26._24_4_ = fVar185 * fVar103;
              auVar26._28_4_ = fVar80;
              fVar142 = auVar18._0_4_;
              fVar146 = auVar18._4_4_;
              auVar27._4_4_ = fVar146 * fVar113;
              auVar27._0_4_ = fVar142 * fVar111;
              fVar148 = auVar18._8_4_;
              auVar27._8_4_ = fVar148 * fVar114;
              fVar150 = auVar18._12_4_;
              auVar27._12_4_ = fVar150 * fVar115;
              fVar152 = auVar18._16_4_;
              auVar27._16_4_ = fVar152 * fVar116;
              fVar154 = auVar18._20_4_;
              auVar27._20_4_ = fVar154 * fVar117;
              fVar156 = auVar18._24_4_;
              auVar27._24_4_ = fVar156 * fVar129;
              auVar27._28_4_ = fVar130;
              auVar19 = vsubps_avx(auVar27,auVar26);
              auVar20 = vsubps_avx(local_1560,auVar70);
              fVar191 = auVar20._0_4_;
              fVar194 = auVar20._4_4_;
              auVar28._4_4_ = fVar194 * fVar113;
              auVar28._0_4_ = fVar191 * fVar111;
              fVar196 = auVar20._8_4_;
              auVar28._8_4_ = fVar196 * fVar114;
              fVar198 = auVar20._12_4_;
              auVar28._12_4_ = fVar198 * fVar115;
              fVar200 = auVar20._16_4_;
              auVar28._16_4_ = fVar200 * fVar116;
              fVar202 = auVar20._20_4_;
              auVar28._20_4_ = fVar202 * fVar117;
              fVar204 = auVar20._24_4_;
              auVar28._24_4_ = fVar204 * fVar129;
              auVar28._28_4_ = auVar14._28_4_ + fVar130;
              fVar130 = fVar5 + auVar70._0_4_;
              fVar111 = fVar7 + auVar70._4_4_;
              fVar113 = fVar9 + auVar70._8_4_;
              fVar114 = fVar76 + auVar70._12_4_;
              fVar115 = fVar78 + auVar70._16_4_;
              fVar116 = fVar81 + auVar70._20_4_;
              fVar117 = fVar12 + auVar70._24_4_;
              fVar141 = local_1560._28_4_ + auVar70._28_4_;
              auVar29._4_4_ = fVar175 * fVar111;
              auVar29._0_4_ = fVar171 * fVar130;
              auVar29._8_4_ = fVar177 * fVar113;
              auVar29._12_4_ = fVar179 * fVar114;
              auVar29._16_4_ = fVar181 * fVar115;
              auVar29._20_4_ = fVar183 * fVar116;
              auVar29._24_4_ = fVar185 * fVar117;
              auVar29._28_4_ = local_14a0._28_4_;
              auVar20 = vsubps_avx(auVar29,auVar28);
              auVar30._4_4_ = fVar146 * fVar111;
              auVar30._0_4_ = fVar142 * fVar130;
              auVar30._8_4_ = fVar148 * fVar113;
              auVar30._12_4_ = fVar150 * fVar114;
              auVar30._16_4_ = fVar152 * fVar115;
              auVar30._20_4_ = fVar154 * fVar116;
              auVar30._24_4_ = fVar156 * fVar117;
              auVar30._28_4_ = fVar141;
              auVar31._4_4_ = fVar194 * fVar98;
              auVar31._0_4_ = fVar191 * fVar97;
              auVar31._8_4_ = fVar196 * fVar99;
              auVar31._12_4_ = fVar198 * fVar100;
              auVar31._16_4_ = fVar200 * fVar101;
              auVar31._20_4_ = fVar202 * fVar102;
              auVar31._24_4_ = fVar204 * fVar103;
              auVar31._28_4_ = fVar80 + fVar94;
              auVar21 = vsubps_avx(auVar31,auVar30);
              local_14e0._0_4_ =
                   local_17a0._4_4_ * auVar19._0_4_ +
                   local_1700._4_4_ * auVar20._0_4_ + fStack_171c * auVar21._0_4_;
              local_14e0._4_4_ =
                   local_17a0._4_4_ * auVar19._4_4_ +
                   local_1700._4_4_ * auVar20._4_4_ + fStack_171c * auVar21._4_4_;
              local_14e0._8_4_ =
                   local_17a0._4_4_ * auVar19._8_4_ +
                   local_1700._4_4_ * auVar20._8_4_ + fStack_171c * auVar21._8_4_;
              local_14e0._12_4_ =
                   local_17a0._4_4_ * auVar19._12_4_ +
                   local_1700._4_4_ * auVar20._12_4_ + fStack_171c * auVar21._12_4_;
              local_14e0._16_4_ =
                   local_17a0._4_4_ * auVar19._16_4_ +
                   local_1700._4_4_ * auVar20._16_4_ + fStack_171c * auVar21._16_4_;
              local_14e0._20_4_ =
                   local_17a0._4_4_ * auVar19._20_4_ +
                   local_1700._4_4_ * auVar20._20_4_ + fStack_171c * auVar21._20_4_;
              local_14e0._24_4_ =
                   local_17a0._4_4_ * auVar19._24_4_ +
                   local_1700._4_4_ * auVar20._24_4_ + fStack_171c * auVar21._24_4_;
              local_14e0._28_4_ = auVar19._28_4_ + auVar20._28_4_ + auVar21._28_4_;
              auVar19 = vsubps_avx(auVar70,auVar15);
              fVar129 = auVar70._0_4_ + auVar15._0_4_;
              fVar135 = auVar70._4_4_ + auVar15._4_4_;
              fVar136 = auVar70._8_4_ + auVar15._8_4_;
              fVar137 = auVar70._12_4_ + auVar15._12_4_;
              fVar138 = auVar70._16_4_ + auVar15._16_4_;
              fVar139 = auVar70._20_4_ + auVar15._20_4_;
              fVar140 = auVar70._24_4_ + auVar15._24_4_;
              fVar80 = auVar70._28_4_ + auVar15._28_4_;
              auVar15 = vsubps_avx(auVar73,auVar16);
              fVar103 = auVar73._0_4_ + auVar16._0_4_;
              fVar111 = auVar73._4_4_ + auVar16._4_4_;
              fVar113 = auVar73._8_4_ + auVar16._8_4_;
              fVar114 = auVar73._12_4_ + auVar16._12_4_;
              fVar115 = auVar73._16_4_ + auVar16._16_4_;
              fVar116 = auVar73._20_4_ + auVar16._20_4_;
              fVar117 = auVar73._24_4_ + auVar16._24_4_;
              auVar70 = vsubps_avx(auVar14,auVar17);
              fVar82 = auVar14._0_4_ + auVar17._0_4_;
              fVar88 = auVar14._4_4_ + auVar17._4_4_;
              fVar89 = auVar14._8_4_ + auVar17._8_4_;
              fVar90 = auVar14._12_4_ + auVar17._12_4_;
              fVar91 = auVar14._16_4_ + auVar17._16_4_;
              fVar92 = auVar14._20_4_ + auVar17._20_4_;
              fVar93 = auVar14._24_4_ + auVar17._24_4_;
              fVar130 = auVar70._0_4_;
              fVar97 = auVar70._4_4_;
              auVar32._4_4_ = fVar97 * fVar111;
              auVar32._0_4_ = fVar130 * fVar103;
              fVar98 = auVar70._8_4_;
              auVar32._8_4_ = fVar98 * fVar113;
              fVar99 = auVar70._12_4_;
              auVar32._12_4_ = fVar99 * fVar114;
              fVar100 = auVar70._16_4_;
              auVar32._16_4_ = fVar100 * fVar115;
              fVar101 = auVar70._20_4_;
              auVar32._20_4_ = fVar101 * fVar116;
              fVar102 = auVar70._24_4_;
              auVar32._24_4_ = fVar102 * fVar117;
              auVar32._28_4_ = fVar94;
              fVar143 = auVar15._0_4_;
              fVar147 = auVar15._4_4_;
              auVar33._4_4_ = fVar147 * fVar88;
              auVar33._0_4_ = fVar143 * fVar82;
              fVar149 = auVar15._8_4_;
              auVar33._8_4_ = fVar149 * fVar89;
              fVar151 = auVar15._12_4_;
              auVar33._12_4_ = fVar151 * fVar90;
              fVar153 = auVar15._16_4_;
              auVar33._16_4_ = fVar153 * fVar91;
              fVar155 = auVar15._20_4_;
              auVar33._20_4_ = fVar155 * fVar92;
              fVar157 = auVar15._24_4_;
              auVar33._24_4_ = fVar157 * fVar93;
              auVar33._28_4_ = fVar141;
              auVar70 = vsubps_avx(auVar33,auVar32);
              fVar104 = auVar19._0_4_;
              fVar112 = auVar19._4_4_;
              auVar34._4_4_ = fVar112 * fVar88;
              auVar34._0_4_ = fVar104 * fVar82;
              fVar82 = auVar19._8_4_;
              auVar34._8_4_ = fVar82 * fVar89;
              fVar88 = auVar19._12_4_;
              auVar34._12_4_ = fVar88 * fVar90;
              fVar89 = auVar19._16_4_;
              auVar34._16_4_ = fVar89 * fVar91;
              fVar90 = auVar19._20_4_;
              auVar34._20_4_ = fVar90 * fVar92;
              fVar91 = auVar19._24_4_;
              auVar34._24_4_ = fVar91 * fVar93;
              auVar34._28_4_ = auVar14._28_4_ + auVar17._28_4_;
              auVar35._4_4_ = fVar97 * fVar135;
              auVar35._0_4_ = fVar130 * fVar129;
              auVar35._8_4_ = fVar98 * fVar136;
              auVar35._12_4_ = fVar99 * fVar137;
              auVar35._16_4_ = fVar100 * fVar138;
              auVar35._20_4_ = fVar101 * fVar139;
              auVar35._24_4_ = fVar102 * fVar140;
              auVar35._28_4_ = fVar141;
              auVar73 = vsubps_avx(auVar35,auVar34);
              auVar36._4_4_ = fVar147 * fVar135;
              auVar36._0_4_ = fVar143 * fVar129;
              auVar36._8_4_ = fVar149 * fVar136;
              auVar36._12_4_ = fVar151 * fVar137;
              auVar36._16_4_ = fVar153 * fVar138;
              auVar36._20_4_ = fVar155 * fVar139;
              auVar36._24_4_ = fVar157 * fVar140;
              auVar36._28_4_ = fVar80;
              auVar37._4_4_ = fVar112 * fVar111;
              auVar37._0_4_ = fVar104 * fVar103;
              auVar37._8_4_ = fVar82 * fVar113;
              auVar37._12_4_ = fVar88 * fVar114;
              auVar37._16_4_ = fVar89 * fVar115;
              auVar37._20_4_ = fVar90 * fVar116;
              auVar37._24_4_ = fVar91 * fVar117;
              auVar37._28_4_ = fVar94 + auVar16._28_4_;
              auVar14 = vsubps_avx(auVar37,auVar36);
              local_1720 = fStack_171c;
              fStack_1718 = fStack_171c;
              fStack_1714 = fStack_171c;
              fStack_1710 = fStack_171c;
              fStack_170c = fStack_171c;
              fStack_1708 = fStack_171c;
              fStack_1704 = fStack_171c;
              local_1700._0_4_ = local_1700._4_4_;
              fStack_16f8 = local_1700._4_4_;
              fStack_16f4 = local_1700._4_4_;
              fStack_16f0 = local_1700._4_4_;
              fStack_16ec = local_1700._4_4_;
              fStack_16e8 = local_1700._4_4_;
              fStack_16e4 = local_1700._4_4_;
              local_17a0._0_4_ = local_17a0._4_4_;
              fStack_1798 = local_17a0._4_4_;
              fStack_1794 = local_17a0._4_4_;
              fStack_1790 = local_17a0._4_4_;
              fStack_178c = local_17a0._4_4_;
              fStack_1788 = local_17a0._4_4_;
              fStack_1784 = local_17a0._4_4_;
              auVar72._0_4_ =
                   local_17a0._4_4_ * auVar70._0_4_ +
                   local_1700._4_4_ * auVar73._0_4_ + fStack_171c * auVar14._0_4_;
              auVar72._4_4_ =
                   local_17a0._4_4_ * auVar70._4_4_ +
                   local_1700._4_4_ * auVar73._4_4_ + fStack_171c * auVar14._4_4_;
              auVar72._8_4_ =
                   local_17a0._4_4_ * auVar70._8_4_ +
                   local_1700._4_4_ * auVar73._8_4_ + fStack_171c * auVar14._8_4_;
              auVar72._12_4_ =
                   local_17a0._4_4_ * auVar70._12_4_ +
                   local_1700._4_4_ * auVar73._12_4_ + fStack_171c * auVar14._12_4_;
              auVar72._16_4_ =
                   local_17a0._4_4_ * auVar70._16_4_ +
                   local_1700._4_4_ * auVar73._16_4_ + fStack_171c * auVar14._16_4_;
              auVar72._20_4_ =
                   local_17a0._4_4_ * auVar70._20_4_ +
                   local_1700._4_4_ * auVar73._20_4_ + fStack_171c * auVar14._20_4_;
              auVar72._24_4_ =
                   local_17a0._4_4_ * auVar70._24_4_ +
                   local_1700._4_4_ * auVar73._24_4_ + fStack_171c * auVar14._24_4_;
              auVar72._28_4_ = fVar80 + fVar80 + auVar14._28_4_;
              local_1380._0_4_ = auVar72._0_4_ + local_14c0._0_4_ + local_14e0._0_4_;
              local_1380._4_4_ = auVar72._4_4_ + local_14c0._4_4_ + local_14e0._4_4_;
              local_1380._8_4_ = auVar72._8_4_ + local_14c0._8_4_ + local_14e0._8_4_;
              local_1380._12_4_ = auVar72._12_4_ + local_14c0._12_4_ + local_14e0._12_4_;
              local_1380._16_4_ = auVar72._16_4_ + local_14c0._16_4_ + local_14e0._16_4_;
              local_1380._20_4_ = auVar72._20_4_ + local_14c0._20_4_ + local_14e0._20_4_;
              local_1380._24_4_ = auVar72._24_4_ + local_14c0._24_4_ + local_14e0._24_4_;
              local_1380._28_4_ = auVar72._28_4_ + local_14c0._28_4_ + local_14e0._28_4_;
              auVar70 = vminps_avx(local_14c0,local_14e0);
              auVar70 = vminps_avx(auVar70,auVar72);
              auVar85._8_4_ = 0x7fffffff;
              auVar85._0_8_ = 0x7fffffff7fffffff;
              auVar85._12_4_ = 0x7fffffff;
              auVar85._16_4_ = 0x7fffffff;
              auVar85._20_4_ = 0x7fffffff;
              auVar85._24_4_ = 0x7fffffff;
              auVar85._28_4_ = 0x7fffffff;
              local_1500 = vandps_avx(local_1380,auVar85);
              fVar94 = local_1500._0_4_ * 1.1920929e-07;
              fVar103 = local_1500._4_4_ * 1.1920929e-07;
              auVar38._4_4_ = fVar103;
              auVar38._0_4_ = fVar94;
              fVar111 = local_1500._8_4_ * 1.1920929e-07;
              auVar38._8_4_ = fVar111;
              fVar113 = local_1500._12_4_ * 1.1920929e-07;
              auVar38._12_4_ = fVar113;
              fVar114 = local_1500._16_4_ * 1.1920929e-07;
              auVar38._16_4_ = fVar114;
              fVar115 = local_1500._20_4_ * 1.1920929e-07;
              auVar38._20_4_ = fVar115;
              fVar116 = local_1500._24_4_ * 1.1920929e-07;
              auVar38._24_4_ = fVar116;
              auVar38._28_4_ = 0x34000000;
              auVar132._0_8_ = CONCAT44(fVar103,fVar94) ^ 0x8000000080000000;
              auVar132._8_4_ = -fVar111;
              auVar132._12_4_ = -fVar113;
              auVar132._16_4_ = -fVar114;
              auVar132._20_4_ = -fVar115;
              auVar132._24_4_ = -fVar116;
              auVar132._28_4_ = 0xb4000000;
              auVar70 = vcmpps_avx(auVar70,auVar132,5);
              auVar14 = vmaxps_avx(local_14c0,local_14e0);
              auVar73 = vmaxps_avx(auVar14,auVar72);
              auVar73 = vcmpps_avx(auVar73,auVar38,2);
              auVar73 = vorps_avx(auVar70,auVar73);
              if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar73 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar73 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar73 >> 0x7f,0) == '\0') &&
                    (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar73 >> 0xbf,0) == '\0') &&
                  (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar73[0x1f]) {
LAB_0030c38f:
                auVar128 = ZEXT3264(local_15a0);
                auVar134 = ZEXT3264(local_15c0);
                auVar145 = ZEXT3264(local_15e0);
                auVar160 = ZEXT3264(local_1600);
                auVar163 = ZEXT3264(local_1620);
                auVar173 = ZEXT3264(local_1640);
                auVar187 = ZEXT3264(local_1660);
                auVar189 = ZEXT3264(local_1680);
                auVar110 = ZEXT3264(local_16a0);
                auVar121 = ZEXT3264(local_16c0);
                auVar192 = ZEXT3264(local_16e0);
              }
              else {
                auVar39._4_4_ = fVar146 * fVar122;
                auVar39._0_4_ = fVar142 * fVar118;
                auVar39._8_4_ = fVar148 * fVar123;
                auVar39._12_4_ = fVar150 * fVar124;
                auVar39._16_4_ = fVar152 * fVar125;
                auVar39._20_4_ = fVar154 * fVar126;
                auVar39._24_4_ = fVar156 * fVar127;
                auVar39._28_4_ = auVar70._28_4_;
                auVar40._4_4_ = fVar175 * fVar174;
                auVar40._0_4_ = fVar171 * fVar170;
                auVar40._8_4_ = fVar177 * fVar176;
                auVar40._12_4_ = fVar179 * fVar178;
                auVar40._16_4_ = fVar181 * fVar180;
                auVar40._20_4_ = fVar183 * fVar182;
                auVar40._24_4_ = fVar185 * fVar184;
                auVar40._28_4_ = 0x34000000;
                auVar16 = vsubps_avx(auVar40,auVar39);
                auVar41._4_4_ = fVar175 * fVar147;
                auVar41._0_4_ = fVar171 * fVar143;
                auVar41._8_4_ = fVar177 * fVar149;
                auVar41._12_4_ = fVar179 * fVar151;
                auVar41._16_4_ = fVar181 * fVar153;
                auVar41._20_4_ = fVar183 * fVar155;
                auVar41._24_4_ = fVar185 * fVar157;
                auVar41._28_4_ = auVar14._28_4_;
                auVar42._4_4_ = fVar146 * fVar97;
                auVar42._0_4_ = fVar142 * fVar130;
                auVar42._8_4_ = fVar148 * fVar98;
                auVar42._12_4_ = fVar150 * fVar99;
                auVar42._16_4_ = fVar152 * fVar100;
                auVar42._20_4_ = fVar154 * fVar101;
                auVar42._24_4_ = fVar156 * fVar102;
                auVar42._28_4_ = auVar18._28_4_;
                auVar17 = vsubps_avx(auVar42,auVar41);
                auVar159._8_4_ = 0x7fffffff;
                auVar159._0_8_ = 0x7fffffff7fffffff;
                auVar159._12_4_ = 0x7fffffff;
                auVar159._16_4_ = 0x7fffffff;
                auVar159._20_4_ = 0x7fffffff;
                auVar159._24_4_ = 0x7fffffff;
                auVar159._28_4_ = 0x7fffffff;
                auVar70 = vandps_avx(auVar159,auVar39);
                auVar14 = vandps_avx(auVar41,auVar159);
                auVar70 = vcmpps_avx(auVar70,auVar14,1);
                local_1360 = vblendvps_avx(auVar17,auVar16,auVar70);
                auVar43._4_4_ = fVar194 * fVar97;
                auVar43._0_4_ = fVar191 * fVar130;
                auVar43._8_4_ = fVar196 * fVar98;
                auVar43._12_4_ = fVar198 * fVar99;
                auVar43._16_4_ = fVar200 * fVar100;
                auVar43._20_4_ = fVar202 * fVar101;
                auVar43._24_4_ = fVar204 * fVar102;
                auVar43._28_4_ = auVar70._28_4_;
                auVar44._4_4_ = fVar194 * fVar122;
                auVar44._0_4_ = fVar191 * fVar118;
                auVar44._8_4_ = fVar196 * fVar123;
                auVar44._12_4_ = fVar198 * fVar124;
                auVar44._16_4_ = fVar200 * fVar125;
                auVar44._20_4_ = fVar202 * fVar126;
                auVar44._24_4_ = fVar204 * fVar127;
                auVar44._28_4_ = auVar16._28_4_;
                auVar45._4_4_ = fVar164 * fVar175;
                auVar45._0_4_ = fVar161 * fVar171;
                auVar45._8_4_ = fVar165 * fVar177;
                auVar45._12_4_ = fVar166 * fVar179;
                auVar45._16_4_ = fVar167 * fVar181;
                auVar45._20_4_ = fVar168 * fVar183;
                auVar45._24_4_ = fVar169 * fVar185;
                auVar45._28_4_ = local_1480._28_4_;
                auVar16 = vsubps_avx(auVar44,auVar45);
                auVar46._4_4_ = fVar175 * fVar112;
                auVar46._0_4_ = fVar171 * fVar104;
                auVar46._8_4_ = fVar177 * fVar82;
                auVar46._12_4_ = fVar179 * fVar88;
                auVar46._16_4_ = fVar181 * fVar89;
                auVar46._20_4_ = fVar183 * fVar90;
                auVar46._24_4_ = fVar185 * fVar91;
                auVar46._28_4_ = auVar14._28_4_;
                auVar17 = vsubps_avx(auVar46,auVar43);
                auVar70 = vandps_avx(auVar159,auVar45);
                auVar14 = vandps_avx(auVar159,auVar43);
                auVar70 = vcmpps_avx(auVar70,auVar14,1);
                local_1340 = vblendvps_avx(auVar17,auVar16,auVar70);
                auVar47._4_4_ = fVar146 * fVar112;
                auVar47._0_4_ = fVar142 * fVar104;
                auVar47._8_4_ = fVar148 * fVar82;
                auVar47._12_4_ = fVar150 * fVar88;
                auVar47._16_4_ = fVar152 * fVar89;
                auVar47._20_4_ = fVar154 * fVar90;
                auVar47._24_4_ = fVar156 * fVar91;
                auVar47._28_4_ = auVar70._28_4_;
                auVar48._4_4_ = fVar164 * fVar146;
                auVar48._0_4_ = fVar161 * fVar142;
                auVar48._8_4_ = fVar165 * fVar148;
                auVar48._12_4_ = fVar166 * fVar150;
                auVar48._16_4_ = fVar167 * fVar152;
                auVar48._20_4_ = fVar168 * fVar154;
                auVar48._24_4_ = fVar169 * fVar156;
                auVar48._28_4_ = auVar16._28_4_;
                auVar49._4_4_ = fVar194 * fVar174;
                auVar49._0_4_ = fVar191 * fVar170;
                auVar49._8_4_ = fVar196 * fVar176;
                auVar49._12_4_ = fVar198 * fVar178;
                auVar49._16_4_ = fVar200 * fVar180;
                auVar49._20_4_ = fVar202 * fVar182;
                auVar49._24_4_ = fVar204 * fVar184;
                auVar49._28_4_ = auVar19._28_4_;
                auVar50._4_4_ = fVar194 * fVar147;
                auVar50._0_4_ = fVar191 * fVar143;
                auVar50._8_4_ = fVar196 * fVar149;
                auVar50._12_4_ = fVar198 * fVar151;
                auVar50._16_4_ = fVar200 * fVar153;
                auVar50._20_4_ = fVar202 * fVar155;
                auVar50._24_4_ = fVar204 * fVar157;
                auVar50._28_4_ = auVar15._28_4_;
                auVar15 = vsubps_avx(auVar48,auVar49);
                auVar16 = vsubps_avx(auVar50,auVar47);
                auVar70 = vandps_avx(auVar159,auVar49);
                auVar14 = vandps_avx(auVar159,auVar47);
                auVar14 = vcmpps_avx(auVar70,auVar14,1);
                local_1320 = vblendvps_avx(auVar16,auVar15,auVar14);
                auVar69 = vpackssdw_avx(auVar73._0_16_,auVar73._16_16_);
                fVar94 = local_1320._0_4_;
                fVar97 = local_1320._4_4_;
                fVar98 = local_1320._8_4_;
                fVar99 = local_1320._12_4_;
                fVar100 = local_1320._16_4_;
                fVar101 = local_1320._20_4_;
                fVar102 = local_1320._24_4_;
                fVar129 = local_1340._0_4_;
                fVar135 = local_1340._4_4_;
                fVar136 = local_1340._8_4_;
                fVar137 = local_1340._12_4_;
                fVar138 = local_1340._16_4_;
                fVar139 = local_1340._20_4_;
                fVar140 = local_1340._24_4_;
                fVar80 = local_1360._0_4_;
                fVar82 = local_1360._4_4_;
                fVar88 = local_1360._8_4_;
                fVar89 = local_1360._12_4_;
                fVar90 = local_1360._16_4_;
                fVar91 = local_1360._20_4_;
                fVar92 = local_1360._24_4_;
                fVar130 = fVar80 * local_17a0._4_4_ +
                          fVar129 * local_1700._4_4_ + fVar94 * fStack_171c;
                fVar103 = fVar82 * local_17a0._4_4_ +
                          fVar135 * local_1700._4_4_ + fVar97 * fStack_171c;
                fVar111 = fVar88 * local_17a0._4_4_ +
                          fVar136 * local_1700._4_4_ + fVar98 * fStack_171c;
                fVar113 = fVar89 * local_17a0._4_4_ +
                          fVar137 * local_1700._4_4_ + fVar99 * fStack_171c;
                fVar114 = fVar90 * local_17a0._4_4_ +
                          fVar138 * local_1700._4_4_ + fVar100 * fStack_171c;
                fVar115 = fVar91 * local_17a0._4_4_ +
                          fVar139 * local_1700._4_4_ + fVar101 * fStack_171c;
                fVar116 = fVar92 * local_17a0._4_4_ +
                          fVar140 * local_1700._4_4_ + fVar102 * fStack_171c;
                fVar117 = auVar15._28_4_ + auVar15._28_4_ + 0.0;
                auVar86._0_4_ = fVar130 + fVar130;
                auVar86._4_4_ = fVar103 + fVar103;
                auVar86._8_4_ = fVar111 + fVar111;
                auVar86._12_4_ = fVar113 + fVar113;
                auVar86._16_4_ = fVar114 + fVar114;
                auVar86._20_4_ = fVar115 + fVar115;
                auVar86._24_4_ = fVar116 + fVar116;
                auVar86._28_4_ = fVar117 + fVar117;
                fVar130 = auVar70._28_4_;
                auVar70 = vrcpps_avx(auVar86);
                fVar103 = fVar80 * fVar5 + fVar129 * fVar190 + fVar94 * fVar1;
                fVar111 = fVar82 * fVar7 + fVar135 * fVar193 + fVar97 * fVar6;
                fVar113 = fVar88 * fVar9 + fVar136 * fVar195 + fVar98 * fVar8;
                fVar76 = fVar89 * fVar76 + fVar137 * fVar197 + fVar99 * fVar10;
                fVar77 = fVar90 * fVar78 + fVar138 * fVar199 + fVar100 * fVar77;
                fVar78 = fVar91 * fVar81 + fVar139 * fVar201 + fVar101 * fVar79;
                fVar79 = fVar92 * fVar12 + fVar140 * fVar203 + fVar102 * fVar11;
                fVar81 = fVar130 + fVar130 + fVar117;
                fVar1 = auVar70._0_4_;
                fVar5 = auVar70._4_4_;
                auVar51._4_4_ = auVar86._4_4_ * fVar5;
                auVar51._0_4_ = auVar86._0_4_ * fVar1;
                fVar6 = auVar70._8_4_;
                auVar51._8_4_ = auVar86._8_4_ * fVar6;
                fVar7 = auVar70._12_4_;
                auVar51._12_4_ = auVar86._12_4_ * fVar7;
                fVar8 = auVar70._16_4_;
                auVar51._16_4_ = auVar86._16_4_ * fVar8;
                fVar9 = auVar70._20_4_;
                auVar51._20_4_ = auVar86._20_4_ * fVar9;
                fVar10 = auVar70._24_4_;
                auVar51._24_4_ = auVar86._24_4_ * fVar10;
                auVar51._28_4_ = fVar130;
                auVar133._8_4_ = 0x3f800000;
                auVar133._0_8_ = &DAT_3f8000003f800000;
                auVar133._12_4_ = 0x3f800000;
                auVar133._16_4_ = 0x3f800000;
                auVar133._20_4_ = 0x3f800000;
                auVar133._24_4_ = 0x3f800000;
                auVar133._28_4_ = 0x3f800000;
                auVar70 = vsubps_avx(auVar133,auVar51);
                uVar65 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar119._4_4_ = uVar65;
                auVar119._0_4_ = uVar65;
                auVar119._8_4_ = uVar65;
                auVar119._12_4_ = uVar65;
                auVar119._16_4_ = uVar65;
                auVar119._20_4_ = uVar65;
                auVar119._24_4_ = uVar65;
                auVar119._28_4_ = uVar65;
                local_12a0._4_4_ = (fVar111 + fVar111) * (fVar5 + fVar5 * auVar70._4_4_);
                local_12a0._0_4_ = (fVar103 + fVar103) * (fVar1 + fVar1 * auVar70._0_4_);
                local_12a0._8_4_ = (fVar113 + fVar113) * (fVar6 + fVar6 * auVar70._8_4_);
                local_12a0._12_4_ = (fVar76 + fVar76) * (fVar7 + fVar7 * auVar70._12_4_);
                local_12a0._16_4_ = (fVar77 + fVar77) * (fVar8 + fVar8 * auVar70._16_4_);
                local_12a0._20_4_ = (fVar78 + fVar78) * (fVar9 + fVar9 * auVar70._20_4_);
                local_12a0._24_4_ = (fVar79 + fVar79) * (fVar10 + fVar10 * auVar70._24_4_);
                local_12a0._28_4_ = fVar81 + fVar81;
                auVar70 = vcmpps_avx(auVar119,local_12a0,2);
                fVar1 = ray->tfar;
                auVar120._4_4_ = fVar1;
                auVar120._0_4_ = fVar1;
                auVar120._8_4_ = fVar1;
                auVar120._12_4_ = fVar1;
                auVar120._16_4_ = fVar1;
                auVar120._20_4_ = fVar1;
                auVar120._24_4_ = fVar1;
                auVar120._28_4_ = fVar1;
                auVar73 = vcmpps_avx(local_12a0,auVar120,2);
                auVar70 = vandps_avx(auVar73,auVar70);
                auVar73 = vcmpps_avx(auVar86,_DAT_02020f00,4);
                auVar70 = vandps_avx(auVar70,auVar73);
                auVar105 = vpackssdw_avx(auVar70._0_16_,auVar70._16_16_);
                auVar69 = vpand_avx(auVar105,auVar69);
                auVar105 = vpmovsxwd_avx(auVar69);
                auVar13 = vpshufd_avx(auVar69,0xee);
                auVar13 = vpmovsxwd_avx(auVar13);
                local_1300._16_16_ = auVar13;
                local_1300._0_16_ = auVar105;
                if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_1300 >> 0x7f,0) == '\0') &&
                      (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB161(auVar13 >> 0x3f,0) == '\0') &&
                    (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar13[0xf]) goto LAB_0030c38f;
                local_13c0 = local_14c0._0_4_;
                fStack_13bc = local_14c0._4_4_;
                fStack_13b8 = local_14c0._8_4_;
                fStack_13b4 = local_14c0._12_4_;
                fStack_13b0 = local_14c0._16_4_;
                fStack_13ac = local_14c0._20_4_;
                fStack_13a8 = local_14c0._24_4_;
                fStack_13a4 = local_14c0._28_4_;
                local_13a0 = local_14e0._0_4_;
                fStack_139c = local_14e0._4_4_;
                fStack_1398 = local_14e0._8_4_;
                fStack_1394 = local_14e0._12_4_;
                fStack_1390 = local_14e0._16_4_;
                fStack_138c = local_14e0._20_4_;
                fStack_1388 = local_14e0._24_4_;
                fStack_1384 = local_14e0._28_4_;
                local_1220 = local_1520;
                pSVar63 = context->scene;
                auVar70 = vrcpps_avx(local_1380);
                fVar1 = auVar70._0_4_;
                fVar5 = auVar70._4_4_;
                auVar52._4_4_ = local_1380._4_4_ * fVar5;
                auVar52._0_4_ = local_1380._0_4_ * fVar1;
                fVar6 = auVar70._8_4_;
                auVar52._8_4_ = local_1380._8_4_ * fVar6;
                fVar7 = auVar70._12_4_;
                auVar52._12_4_ = local_1380._12_4_ * fVar7;
                fVar8 = auVar70._16_4_;
                auVar52._16_4_ = local_1380._16_4_ * fVar8;
                fVar9 = auVar70._20_4_;
                auVar52._20_4_ = local_1380._20_4_ * fVar9;
                fVar10 = auVar70._24_4_;
                auVar52._24_4_ = local_1380._24_4_ * fVar10;
                auVar52._28_4_ = auVar13._12_4_;
                auVar109._8_4_ = 0x3f800000;
                auVar109._0_8_ = &DAT_3f8000003f800000;
                auVar109._12_4_ = 0x3f800000;
                auVar109._16_4_ = 0x3f800000;
                auVar109._20_4_ = 0x3f800000;
                auVar109._24_4_ = 0x3f800000;
                auVar109._28_4_ = 0x3f800000;
                auVar73 = vsubps_avx(auVar109,auVar52);
                auVar75._0_4_ = fVar1 + fVar1 * auVar73._0_4_;
                auVar75._4_4_ = fVar5 + fVar5 * auVar73._4_4_;
                auVar75._8_4_ = fVar6 + fVar6 * auVar73._8_4_;
                auVar75._12_4_ = fVar7 + fVar7 * auVar73._12_4_;
                auVar75._16_4_ = fVar8 + fVar8 * auVar73._16_4_;
                auVar75._20_4_ = fVar9 + fVar9 * auVar73._20_4_;
                auVar75._24_4_ = fVar10 + fVar10 * auVar73._24_4_;
                auVar75._28_4_ = auVar70._28_4_ + auVar73._28_4_;
                auVar87._8_4_ = 0x219392ef;
                auVar87._0_8_ = 0x219392ef219392ef;
                auVar87._12_4_ = 0x219392ef;
                auVar87._16_4_ = 0x219392ef;
                auVar87._20_4_ = 0x219392ef;
                auVar87._24_4_ = 0x219392ef;
                auVar87._28_4_ = 0x219392ef;
                auVar73 = vcmpps_avx(local_1500,auVar87,5);
                auVar70 = vandps_avx(auVar73,auVar75);
                auVar53._4_4_ = local_14c0._4_4_ * auVar70._4_4_;
                auVar53._0_4_ = local_14c0._0_4_ * auVar70._0_4_;
                auVar53._8_4_ = local_14c0._8_4_ * auVar70._8_4_;
                auVar53._12_4_ = local_14c0._12_4_ * auVar70._12_4_;
                auVar53._16_4_ = local_14c0._16_4_ * auVar70._16_4_;
                auVar53._20_4_ = local_14c0._20_4_ * auVar70._20_4_;
                auVar53._24_4_ = local_14c0._24_4_ * auVar70._24_4_;
                auVar53._28_4_ = auVar73._28_4_;
                auVar73 = vminps_avx(auVar53,auVar109);
                auVar54._4_4_ = local_14e0._4_4_ * auVar70._4_4_;
                auVar54._0_4_ = local_14e0._0_4_ * auVar70._0_4_;
                auVar54._8_4_ = local_14e0._8_4_ * auVar70._8_4_;
                auVar54._12_4_ = local_14e0._12_4_ * auVar70._12_4_;
                auVar54._16_4_ = local_14e0._16_4_ * auVar70._16_4_;
                auVar54._20_4_ = local_14e0._20_4_ * auVar70._20_4_;
                auVar54._24_4_ = local_14e0._24_4_ * auVar70._24_4_;
                auVar54._28_4_ = auVar70._28_4_;
                auVar70 = vminps_avx(auVar54,auVar109);
                auVar14 = vsubps_avx(auVar109,auVar73);
                auVar15 = vsubps_avx(auVar109,auVar70);
                local_12c0 = vblendvps_avx(auVar70,auVar14,local_1520);
                local_12e0 = vblendvps_avx(auVar73,auVar15,local_1520);
                fVar1 = local_1540._0_4_;
                fVar5 = local_1540._4_4_;
                local_1280._4_4_ = fVar82 * fVar5;
                local_1280._0_4_ = fVar80 * fVar1;
                fVar6 = local_1540._8_4_;
                local_1280._8_4_ = fVar88 * fVar6;
                fVar7 = local_1540._12_4_;
                local_1280._12_4_ = fVar89 * fVar7;
                fVar8 = local_1540._16_4_;
                local_1280._16_4_ = fVar90 * fVar8;
                fVar9 = local_1540._20_4_;
                local_1280._20_4_ = fVar91 * fVar9;
                fVar10 = local_1540._24_4_;
                local_1280._24_4_ = fVar92 * fVar10;
                local_1280._28_4_ = local_12c0._28_4_;
                local_1260._4_4_ = fVar135 * fVar5;
                local_1260._0_4_ = fVar129 * fVar1;
                local_1260._8_4_ = fVar136 * fVar6;
                local_1260._12_4_ = fVar137 * fVar7;
                local_1260._16_4_ = fVar138 * fVar8;
                local_1260._20_4_ = fVar139 * fVar9;
                local_1260._24_4_ = fVar140 * fVar10;
                local_1260._28_4_ = local_12e0._28_4_;
                local_1240[0] = fVar1 * fVar94;
                local_1240[1] = fVar5 * fVar97;
                local_1240[2] = fVar6 * fVar98;
                local_1240[3] = fVar7 * fVar99;
                fStack_1230 = fVar8 * fVar100;
                fStack_122c = fVar9 * fVar101;
                fStack_1228 = fVar10 * fVar102;
                uStack_1224 = local_1320._28_4_;
                auVar69 = vpsllw_avx(auVar69,0xf);
                auVar69 = vpacksswb_avx(auVar69,auVar69);
                uVar62 = (ulong)(byte)(SUB161(auVar69 >> 7,0) & 1 |
                                       (SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                                       (SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                                       (SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                                       (SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                                       (SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                                       (SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                                      SUB161(auVar69 >> 0x3f,0) << 7);
                auVar128 = ZEXT3264(local_15a0);
                auVar134 = ZEXT3264(local_15c0);
                auVar145 = ZEXT3264(local_15e0);
                auVar160 = ZEXT3264(local_1600);
                auVar163 = ZEXT3264(local_1620);
                auVar173 = ZEXT3264(local_1640);
                auVar187 = ZEXT3264(local_1660);
                auVar189 = ZEXT3264(local_1680);
                auVar110 = ZEXT3264(local_16a0);
                auVar121 = ZEXT3264(local_16c0);
                auVar192 = ZEXT3264(local_16e0);
                local_1480 = auVar71;
                do {
                  uVar64 = 0;
                  if (uVar62 != 0) {
                    for (; (uVar62 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
                    }
                  }
                  local_1768 = *(uint *)((long)&local_13e0 + uVar64 * 4);
                  pGVar3 = (pSVar63->geometries).items[local_1768].ptr;
                  if ((pGVar3->mask & ray->mask) == 0) {
                    uVar62 = uVar62 ^ 1L << (uVar64 & 0x3f);
                    bVar55 = true;
                  }
                  else {
                    pRVar4 = context->args;
                    if ((pRVar4->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar55 = false;
                    }
                    else {
                      local_1700 = uVar60;
                      local_1750.context = context->user;
                      local_1780 = *(undefined4 *)(local_1280 + uVar64 * 4);
                      local_177c = local_1240[uVar64 - 8];
                      local_1778 = local_1240[uVar64];
                      local_1774 = *(undefined4 *)(local_12e0 + uVar64 * 4);
                      local_1770 = *(undefined4 *)(local_12c0 + uVar64 * 4);
                      local_176c = *(undefined4 *)((long)&local_1400 + uVar64 * 4);
                      local_1764 = (local_1750.context)->instID[0];
                      local_1760 = (local_1750.context)->instPrimID[0];
                      local_1720 = ray->tfar;
                      ray->tfar = *(float *)(local_12a0 + uVar64 * 4);
                      local_17dc = -1;
                      local_1750.valid = &local_17dc;
                      local_1750.geometryUserPtr = pGVar3->userPtr;
                      local_1750.ray = (RTCRayN *)ray;
                      local_1750.hit = (RTCHitN *)&local_1780;
                      local_1750.N = 1;
                      local_17a0 = pSVar63;
                      if (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0030c280:
                        if (pRVar4->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar4->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar3->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar4->filter)(&local_1750);
                            auVar192 = ZEXT3264(local_16e0);
                            auVar121 = ZEXT3264(local_16c0);
                            auVar110 = ZEXT3264(local_16a0);
                            auVar189 = ZEXT3264(local_1680);
                            auVar187 = ZEXT3264(local_1660);
                            auVar173 = ZEXT3264(local_1640);
                            auVar163 = ZEXT3264(local_1620);
                            auVar160 = ZEXT3264(local_1600);
                            auVar145 = ZEXT3264(local_15e0);
                            auVar134 = ZEXT3264(local_15c0);
                            auVar128 = ZEXT3264(local_15a0);
                            pSVar63 = local_17a0;
                          }
                          if (*local_1750.valid == 0) goto LAB_0030c33f;
                        }
                        bVar55 = false;
                      }
                      else {
                        local_1560._0_8_ = context;
                        local_1580._0_8_ = ray;
                        (*pGVar3->occlusionFilterN)(&local_1750);
                        auVar192 = ZEXT3264(local_16e0);
                        auVar121 = ZEXT3264(local_16c0);
                        auVar110 = ZEXT3264(local_16a0);
                        auVar189 = ZEXT3264(local_1680);
                        auVar187 = ZEXT3264(local_1660);
                        auVar173 = ZEXT3264(local_1640);
                        auVar163 = ZEXT3264(local_1620);
                        auVar160 = ZEXT3264(local_1600);
                        auVar145 = ZEXT3264(local_15e0);
                        auVar134 = ZEXT3264(local_15c0);
                        auVar128 = ZEXT3264(local_15a0);
                        context = (RayQueryContext *)local_1560._0_8_;
                        ray = (Ray *)local_1580._0_8_;
                        pSVar63 = local_17a0;
                        if (*local_1750.valid != 0) goto LAB_0030c280;
LAB_0030c33f:
                        ray->tfar = local_1720;
                        uVar62 = uVar62 ^ 1L << (uVar64 & 0x3f);
                        bVar55 = true;
                      }
                      uVar60 = local_1700;
                    }
                  }
                  iVar58 = 0;
                  uVar64 = local_17c0;
                  uVar66 = local_17b0;
                  uVar67 = local_17b8;
                  if (!bVar55) {
                    if (bVar68) {
                      ray->tfar = -INFINITY;
                      iVar58 = 3;
                    }
                    goto LAB_0030c414;
                  }
                } while (uVar62 != 0);
              }
              iVar58 = 0;
              local_17a8 = local_17a8 + 1;
              bVar68 = local_17a8 < uVar60;
            } while (local_17a8 != uVar60);
          }
        }
LAB_0030c414:
      } while (iVar58 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }